

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O1

void amrex::EB_interp_CC_to_Centroid
               (MultiFab *cent,MultiFab *cc,int scomp,int dcomp,int ncomp,Geometry *geom)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FabType FVar7;
  uint uVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  void *__s;
  int iVar17;
  long lVar18;
  bool bVar19;
  Periodicity PVar20;
  MFIter mfi;
  Box thread_box;
  MFItInfo mfi_info;
  long local_350;
  long local_348;
  Box local_32c;
  FabArray<amrex::FArrayBox> *local_310;
  ulong local_308;
  long local_300;
  ulong local_2f8;
  FabArray<amrex::FArrayBox> *local_2f0;
  FabArray<amrex::EBCellFlagFab> *local_2e8;
  ulong local_2e0;
  Array4<double> local_2d8;
  Geometry *local_298;
  MultiCutFab *local_290;
  MFIter local_288;
  Box local_228;
  Array4<const_double> local_208;
  Array4<const_double> local_1c8;
  Array4<const_amrex::EBCellFlag> local_188;
  anon_class_256_4_1798f1dc local_148;
  MFItInfo local_44;
  
  local_310 = &cc->super_FabArray<amrex::FArrayBox>;
  local_2f0 = &cent->super_FabArray<amrex::FArrayBox>;
  local_298 = geom;
  lVar9 = __dynamic_cast((cc->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&FabFactory<amrex::FArrayBox>::typeinfo,
                         &EBFArrayBoxFactory::typeinfo,0);
  if (lVar9 == 0) {
    __cxa_bad_cast();
  }
  local_2e8 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar9 + 0xd8));
  local_290 = EBDataCollection::getCentroid(*(EBDataCollection **)(lVar9 + 0xd8));
  local_44.do_tiling = false;
  local_44.num_streams = Gpu::Device::max_gpu_streams;
  local_44.tilesize.vect[0] = 0;
  local_44.tilesize.vect[1] = 0;
  local_44.tilesize.vect[2] = 0;
  local_44.dynamic = true;
  local_44.device_sync = true;
  MFIter::MFIter(&local_288,&local_310->super_FabArrayBase,&local_44);
  if (local_288.currentIndex < local_288.endIndex) {
    local_2e0 = (ulong)(uint)ncomp;
    do {
      BATransformer::operator()
                (&local_32c,&((local_288.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_288.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_288.currentIndex] * 0x1c +
                        *(long *)&((((local_288.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_2d8,local_2f0,&local_288,dcomp);
      piVar10 = &local_288.currentIndex;
      if (local_288.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar10 = ((local_288.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + local_288.currentIndex;
      }
      FVar7 = EBCellFlagFab::getType
                        ((local_2e8->m_fabs_v).
                         super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[*piVar10],&local_32c);
      iVar6 = local_32c.bigend.vect[2];
      iVar5 = local_32c.bigend.vect[1];
      iVar4 = local_32c.bigend.vect[0];
      iVar3 = local_32c.smallend.vect[2];
      iVar2 = local_32c.smallend.vect[1];
      iVar17 = local_32c.smallend.vect[0];
      if (FVar7 == regular) {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_148,local_310,&local_288,scomp);
        if (0 < ncomp) {
          local_2f8 = (ulong)(uint)local_32c.bigend.vect[1];
          lVar9 = (long)local_32c.smallend.vect[1];
          local_300 = (long)local_32c.smallend.vect[0] * 8;
          local_348 = 0;
          uVar11 = 0;
          do {
            local_308 = uVar11;
            iVar17 = local_32c.smallend.vect[2];
            if (local_32c.smallend.vect[2] <= local_32c.bigend.vect[2]) {
              do {
                if (local_32c.smallend.vect[1] <= local_32c.bigend.vect[1]) {
                  lVar16 = (long)local_2d8.p +
                           local_2d8.nstride * local_348 +
                           (lVar9 - local_2d8.begin.y) * local_2d8.jstride * 8 +
                           ((long)iVar17 - (long)local_2d8.begin.z) * local_2d8.kstride * 8 +
                           (long)local_2d8.begin.x * -8 + local_300;
                  lVar13 = CONCAT44(local_148.flag.jstride._4_4_,(int)local_148.flag.jstride) * 8;
                  lVar14 = (long)&local_148.flag.p
                                  [(long)local_32c.smallend.vect[0] * 2 +
                                   (long)local_148.flag.begin.x * -2 +
                                   ((long)iVar17 - (long)local_148.flag.begin.z) *
                                   local_148.flag.kstride * 2].flag +
                           local_148.flag.nstride * local_348 +
                           (lVar9 - local_148.flag.begin.y) * lVar13;
                  lVar18 = lVar9;
                  do {
                    if (local_32c.smallend.vect[0] <= local_32c.bigend.vect[0]) {
                      lVar12 = 0;
                      do {
                        *(undefined8 *)(lVar16 + lVar12 * 8) = *(undefined8 *)(lVar14 + lVar12 * 8);
                        lVar12 = lVar12 + 1;
                      } while ((local_32c.bigend.vect[0] - local_32c.smallend.vect[0]) + 1 !=
                               (int)lVar12);
                    }
                    lVar18 = lVar18 + 1;
                    lVar16 = lVar16 + local_2d8.jstride * 8;
                    lVar14 = lVar14 + lVar13;
                  } while (local_32c.bigend.vect[1] + 1U != (int)lVar18);
                }
                bVar19 = iVar17 != local_32c.bigend.vect[2];
                iVar17 = iVar17 + 1;
              } while (bVar19);
            }
            local_348 = local_348 + 8;
            uVar11 = local_308 + 1;
          } while (local_308 + 1 != local_2e0);
        }
      }
      else if (FVar7 == covered) {
        if (0 < ncomp) {
          lVar9 = (long)local_32c.smallend.vect[1];
          local_2f8 = (long)local_32c.smallend.vect[0] << 3;
          uVar8 = local_32c.bigend.vect[0] - local_32c.smallend.vect[0];
          local_300 = CONCAT44(local_300._4_4_,
                               (local_32c.bigend.vect[1] - local_32c.smallend.vect[1]) + 1);
          local_350 = 0;
          uVar11 = 0;
          do {
            local_308 = uVar11;
            iVar1 = iVar3;
            if (iVar3 <= iVar6) {
              do {
                if (iVar2 <= iVar5) {
                  lVar18 = local_2d8.jstride * 8;
                  __s = (void *)((long)local_2d8.p +
                                local_2d8.nstride * local_350 +
                                (lVar9 - local_2d8.begin.y) * lVar18 +
                                (iVar1 - local_2d8.begin.z) * local_2d8.kstride * 8 +
                                (long)local_2d8.begin.x * -8 + local_2f8);
                  iVar15 = (int)local_300;
                  do {
                    if (iVar17 <= iVar4) {
                      memset(__s,0,(ulong)uVar8 * 8 + 8);
                    }
                    __s = (void *)((long)__s + lVar18);
                    iVar15 = iVar15 + -1;
                  } while (iVar15 != 0);
                }
                bVar19 = iVar1 != iVar6;
                iVar1 = iVar1 + 1;
              } while (bVar19);
            }
            uVar11 = local_308 + 1;
            local_350 = local_350 + 8;
          } while (uVar11 != local_2e0);
        }
      }
      else {
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_188,local_2e8,&local_288);
        MultiCutFab::const_array(&local_1c8,local_290,&local_288);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_208,local_310,&local_288,scomp);
        local_148.flag.end.z = local_188.end.z;
        local_148.flag.ncomp = local_188.ncomp;
        local_148.flag.begin.x = local_188.begin.x;
        local_148.flag.begin.y = local_188.begin.y;
        local_148.flag.begin.z = local_188.begin.z;
        local_148.flag.kstride = local_188.kstride;
        local_148.flag.nstride = local_188.nstride;
        local_148.flag.p = local_188.p;
        local_148.flag.jstride._0_4_ = (int)local_188.jstride;
        local_148.flag.jstride._4_4_ = (undefined4)((ulong)local_188.jstride >> 0x20);
        local_148.phicent.end.z = local_2d8.end.z;
        local_148.phicent.ncomp = local_2d8.ncomp;
        local_148.phicent.kstride = local_2d8.kstride;
        local_148.phicent.nstride = local_2d8.nstride;
        local_148.phicent.p = local_2d8.p;
        local_148.phicent.jstride = local_2d8.jstride;
        local_148.phicc.end.z = local_208.end.z;
        local_148.phicc.ncomp = local_208.ncomp;
        local_148.phicc.begin.x = local_208.begin.x;
        local_148.phicc.begin.y = local_208.begin.y;
        local_148.phicc.kstride = local_208.kstride;
        local_148.phicc.nstride = local_208.nstride;
        local_148.phicc.p = local_208.p;
        local_148.phicc.jstride = local_208.jstride;
        local_148.cent.end.z = local_1c8.end.z;
        local_148.cent.ncomp = local_1c8.ncomp;
        local_148.cent.begin.x = local_1c8.begin.x;
        local_148.cent.begin.y = local_1c8.begin.y;
        local_148.cent.kstride = local_1c8.kstride;
        local_148.cent.nstride = local_1c8.nstride;
        local_148.cent.p = local_1c8.p;
        local_148.cent.jstride = local_1c8.jstride;
        Loop<amrex::eb_interp_cc2cent(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,int)::_lambda(int,int,int,int)_1_>
                  (&local_228,ncomp,&local_148);
      }
      MFIter::operator++(&local_288);
    } while (local_288.currentIndex < local_288.endIndex);
  }
  MFIter::~MFIter(&local_288);
  PVar20 = Geometry::periodicity(local_298);
  local_148.flag.p = PVar20.period.vect._0_8_;
  local_148.flag.jstride._0_4_ = PVar20.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (local_2f0,dcomp,ncomp,(Periodicity *)&local_148,false);
  return;
}

Assistant:

void
EB_interp_CC_to_Centroid (MultiFab& cent, const MultiFab& cc, int scomp, int dcomp, int ncomp, const Geometry& geom)
{
    const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(cc.Factory());
    const auto& flags = factory.getMultiEBCellFlagFab();
    const auto& loc = factory.getCentroid();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cc, mfi_info);  mfi.isValid(); ++mfi)
    {
        const Box& vbx = mfi.validbox();
        const auto& centfab = cent.array(mfi,dcomp);
        const auto& fabtyp = flags[mfi].getType(vbx);

        if (fabtyp == FabType::covered)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( vbx, ncomp, i, j, k, n,
            {
                centfab(i,j,k,n) = 0.0;
            });
        }
        else if (fabtyp == FabType::regular)
        {
            const auto& ccfab = cc.array(mfi,scomp);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( vbx, ncomp, i, j, k, n,
            {
               centfab(i,j,k,n) = ccfab(i,j,k,n);
            });
        }
        else
        {
            const auto& flagfab = flags.const_array(mfi);
            const auto& locfab = loc.const_array(mfi);
            const auto& ccfab = cc.array(mfi,scomp);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( vbx, thread_box,
            {
                eb_interp_cc2cent(thread_box, centfab, ccfab, flagfab, locfab, ncomp);
            });
        }
    }

    cent.FillBoundary(dcomp,ncomp,geom.periodicity());

}